

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void cfd::core::MergePsbtInputs(wally_psbt *psbt,wally_psbt *psbt_dest,bool ignore_duplicate_error)

{
  bool bVar1;
  int iVar2;
  wally_tx_input *__s2;
  string *message;
  reference puVar3;
  undefined8 uVar4;
  string *in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  allocator *paVar5;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  uint in_stack_fffffffffffffd5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  string local_290;
  string local_270 [32];
  undefined1 local_250 [8];
  string item_key_1;
  ByteData256 local_218;
  undefined1 local_200 [8];
  Txid txid_1;
  wally_tx_input *dest_txin_1;
  string local_1d0 [32];
  CfdSourceLocation local_1b0;
  unsigned_long local_198;
  unsigned_long dst_idx_1;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  uint32_t index;
  CfdSourceLocation local_150;
  string local_138 [32];
  string local_118;
  string local_f8 [32];
  undefined1 local_d8 [8];
  string item_key;
  ByteData local_a8;
  ByteData256 local_90;
  undefined1 local_78 [8];
  Txid txid;
  wally_tx_input *src_txin;
  size_t src_idx;
  wally_tx_input *dest_txin;
  size_t dst_idx;
  vector<unsigned_long,_std::allocator<unsigned_long>_> append_indexes;
  int ret;
  bool is_find;
  bool ignore_duplicate_error_local;
  wally_psbt *psbt_dest_local;
  wally_psbt *psbt_local;
  
  append_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = ignore_duplicate_error;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&dst_idx);
  dest_txin = (wally_tx_input *)0x0;
  do {
    if ((wally_tx_input *)psbt_dest->num_inputs <= dest_txin) {
      __end2 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&dst_idx);
      dst_idx_1 = (unsigned_long)
                  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&dst_idx);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)&dst_idx_1);
        if (!bVar1) {
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&dst_idx);
          return;
        }
        puVar3 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&__end2);
        local_198 = *puVar3;
        __range2._0_4_ = (uint32_t)psbt->num_inputs;
        append_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             wally_psbt_add_input_at(psbt,(uint32_t)__range2,1,psbt_dest->tx->inputs + local_198);
        error_code = (CfdError)((ulong)in_stack_fffffffffffffd48 >> 0x20);
        if ((int)append_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage != 0) break;
        txid_1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = psbt_dest->tx->inputs[local_198].txhash;
        ByteData::ByteData((ByteData *)((long)&item_key_1.field_2 + 8),
                           txid_1.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,0x20);
        ByteData256::ByteData256(&local_218,(ByteData *)((long)&item_key_1.field_2 + 8));
        Txid::Txid((Txid *)local_200,&local_218);
        ByteData256::~ByteData256((ByteData256 *)0x492117);
        ByteData::~ByteData((ByteData *)0x492123);
        Txid::GetHex_abi_cxx11_(&local_290,(Txid *)local_200);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                         (char *)in_stack_fffffffffffffd50);
        ::std::__cxx11::to_string(in_stack_fffffffffffffd5c);
        ::std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffd50);
        ::std::__cxx11::string::~string(local_270);
        ::std::__cxx11::string::~string((string *)&local_290);
        MergePsbtInputItem(psbt->inputs + (uint32_t)__range2,psbt_dest->inputs + local_198,
                           (bool)(append_indexes.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                           (string *)local_250);
        ::std::__cxx11::string::~string((string *)local_250);
        Txid::~Txid((Txid *)0x49220a);
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&__end2);
      }
      local_1b0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_1b0.filename = local_1b0.filename + 1;
      local_1b0.line = 0x27f;
      local_1b0.funcname = "MergePsbtInputs";
      logger::warn<int&>(&local_1b0,"wally_psbt_add_input_at NG[{}]",
                         (int *)&append_indexes.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      dest_txin_1._6_1_ = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1d0,"psbt add global unkonwns error.",(allocator *)((long)&dest_txin_1 + 7));
      CfdException::CfdException(in_stack_fffffffffffffd50,error_code,in_stack_fffffffffffffd40);
      dest_txin_1._6_1_ = 0;
      __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    __s2 = psbt_dest->tx->inputs + (long)dest_txin;
    append_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    for (src_txin = (wally_tx_input *)0x0; src_txin < (wally_tx_input *)psbt->num_inputs;
        src_txin = (wally_tx_input *)(src_txin->txhash + 1)) {
      txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = psbt->tx->inputs[(long)src_txin].txhash;
      if ((((wally_tx_input *)
           txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage)->index == __s2->index) &&
         (iVar2 = memcmp(txid.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,__s2,0x20), iVar2 == 0)) {
        append_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        ByteData::ByteData(&local_a8,
                           txid.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,0x20);
        ByteData256::ByteData256(&local_90,&local_a8);
        Txid::Txid((Txid *)local_78,&local_90);
        ByteData256::~ByteData256((ByteData256 *)0x491b3e);
        ByteData::~ByteData((ByteData *)0x491b4a);
        Txid::GetHex_abi_cxx11_(&local_118,(Txid *)local_78);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                         (char *)in_stack_fffffffffffffd50);
        ::std::__cxx11::to_string(in_stack_fffffffffffffd5c);
        ::std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        ::std::__cxx11::string::~string(local_138);
        ::std::__cxx11::string::~string(local_f8);
        ::std::__cxx11::string::~string((string *)&local_118);
        if ((*(uint32_t *)
              (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 0x24) != __s2->sequence) &&
           ((append_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0)) {
          local_150.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                       ,0x2f);
          local_150.filename = local_150.filename + 1;
          local_150.line = 0x26b;
          local_150.funcname = "MergePsbtInputs";
          logger::warn<std::__cxx11::string&>
                    (&local_150,"psbt sequence duplicate. [{}]",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
          __range2._6_1_ = 1;
          message = (string *)__cxa_allocate_exception(0x30);
          paVar5 = (allocator *)((long)&__range2 + 7);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&index,"psbt sequence duplicate error.",paVar5);
          CfdException::CfdException
                    (in_stack_fffffffffffffd50,(CfdError)((ulong)paVar5 >> 0x20),message);
          __range2._6_1_ = 0;
          __cxa_throw(message,&CfdException::typeinfo,CfdException::~CfdException);
        }
        MergePsbtInputItem(psbt->inputs + (long)src_txin,psbt_dest->inputs + (long)dest_txin,
                           (bool)(append_indexes.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                           (string *)local_d8);
        ::std::__cxx11::string::~string((string *)local_d8);
        Txid::~Txid((Txid *)0x491e61);
        break;
      }
    }
    if ((append_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&dst_idx,
                 (value_type_conflict3 *)&dest_txin);
    }
    dest_txin = (wally_tx_input *)(dest_txin->txhash + 1);
  } while( true );
}

Assistant:

void MergePsbtInputs(
    struct wally_psbt *psbt, const struct wally_psbt *psbt_dest,
    bool ignore_duplicate_error) {
  bool is_find;
  int ret;
  std::vector<size_t> append_indexes;
  for (size_t dst_idx = 0; dst_idx < psbt_dest->num_inputs; ++dst_idx) {
    auto dest_txin = &psbt_dest->tx->inputs[dst_idx];
    is_find = false;
    for (size_t src_idx = 0; src_idx < psbt->num_inputs; ++src_idx) {
      auto src_txin = &psbt->tx->inputs[src_idx];
      if ((src_txin->index == dest_txin->index) &&
          (memcmp(
               src_txin->txhash, dest_txin->txhash,
               sizeof(src_txin->txhash)) == 0)) {
        is_find = true;
        Txid txid(ByteData256(ByteData(
            src_txin->txhash,
            static_cast<uint32_t>(sizeof(src_txin->txhash)))));
        std::string item_key =
            txid.GetHex() + "," + std::to_string(src_txin->index);
        if (src_txin->sequence == dest_txin->sequence) {
          // do nothing
        } else if (ignore_duplicate_error) {
          // do nothing
        } else {
          warn(CFD_LOG_SOURCE, "psbt sequence duplicate. [{}]", item_key);
          throw CfdException(
              kCfdIllegalArgumentError, "psbt sequence duplicate error.");
        }
        MergePsbtInputItem(
            &psbt->inputs[src_idx], &psbt_dest->inputs[dst_idx],
            ignore_duplicate_error, item_key);
        break;
      }
    }
    if (!is_find) append_indexes.push_back(dst_idx);
  }

  uint32_t index;
  for (auto dst_idx : append_indexes) {
    index = static_cast<uint32_t>(psbt->num_inputs);
    ret = wally_psbt_add_input_at(
        psbt, index, WALLY_PSBT_FLAG_NON_FINAL,
        &psbt_dest->tx->inputs[dst_idx]);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_add_input_at NG[{}]", ret);
      throw CfdException(
          kCfdMemoryFullError, "psbt add global unkonwns error.");
    }
    auto dest_txin = &psbt_dest->tx->inputs[dst_idx];
    Txid txid(ByteData256(ByteData(
        dest_txin->txhash, static_cast<uint32_t>(sizeof(dest_txin->txhash)))));
    std::string item_key =
        txid.GetHex() + "," + std::to_string(dest_txin->index);
    MergePsbtInputItem(
        &psbt->inputs[index], &psbt_dest->inputs[dst_idx],
        ignore_duplicate_error, item_key);
  }
}